

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::parse_range_header(string *s,Ranges *ranges)

{
  bool bVar1;
  int iVar2;
  char *b;
  char *e;
  difference_type len;
  difference_type pos;
  smatch m;
  Ranges *ranges_local;
  string *s_local;
  
  if ((parse_range_header(std::__cxx11::string_const&,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>&)
       ::re_first_range_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parse_range_header(std::__cxx11::string_const&,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>&)
                                   ::re_first_range_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse_range_header(std::__cxx11::string_const&,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>&)
                ::re_first_range_abi_cxx11_,"bytes=(\\d*-\\d*(?:,\\s*\\d*-\\d*)*)",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse_range_header(std::__cxx11::string_const&,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>&)
                  ::re_first_range_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse_range_header(std::__cxx11::string_const&,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>&)
                         ::re_first_range_abi_cxx11_);
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&pos);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (s,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&pos,
                     &parse_range_header(std::__cxx11::string_const&,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>&)
                      ::re_first_range_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::position((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&pos,1);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::length((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&pos,1);
    b = (char *)std::__cxx11::string::operator[]((ulong)s);
    e = (char *)std::__cxx11::string::operator[]((ulong)s);
    split<httplib::detail::parse_range_header(std::__cxx11::string_const&,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>&)::_lambda(char_const*,char_const*)_1_>
              (b,e,',',(anon_class_8_1_6936e014)ranges);
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&pos);
  return bVar1;
}

Assistant:

inline bool parse_range_header(const std::string &s, Ranges &ranges) {
  try {
    static auto re_first_range =
        std::regex(R"(bytes=(\d*-\d*(?:,\s*\d*-\d*)*))");
    std::smatch m;
    if (std::regex_match(s, m, re_first_range)) {
      auto pos = m.position(1);
      auto len = m.length(1);
      detail::split(
          &s[pos], &s[pos + len], ',', [&](const char *b, const char *e) {
            static auto re_another_range = std::regex(R"(\s*(\d*)-(\d*))");
            std::cmatch m;
            if (std::regex_match(b, e, m, re_another_range)) {
              ssize_t first = -1;
              if (!m.str(1).empty()) {
                first = static_cast<ssize_t>(std::stoll(m.str(1)));
              }

              ssize_t last = -1;
              if (!m.str(2).empty()) {
                last = static_cast<ssize_t>(std::stoll(m.str(2)));
              }

              if (first != -1 && last != -1 && first > last) {
                throw std::runtime_error("invalid range error");
              }
              ranges.emplace_back(std::make_pair(first, last));
            }
          });
      return true;
    }
    return false;
  } catch (...) { return false; }
}